

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> __thiscall
slang::ast::Compilation::getAttributes(Compilation *this,void *ptr)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  pointer ppAVar8;
  ulong uVar9;
  __extent_storage<18446744073709551615UL> _Var10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  value_type *elements;
  ulong uVar14;
  ulong uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar21;
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = ptr;
  uVar9 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar12 = uVar9 >> ((byte)(this->attributeMap).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
                           .arrays.groups_size_index & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar9 & 0xff];
  ppVar3 = (this->attributeMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
           .arrays.elements_;
  uVar4 = (this->attributeMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
          .arrays.groups_size_mask;
  ppAVar8 = (pointer)0x0;
  uVar14 = 0;
  do {
    pgVar1 = (this->attributeMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
             .arrays.groups_ + uVar12;
    bVar7 = pgVar1->m[0xf].n;
    uVar16 = (uchar)uVar2;
    auVar20[0] = -(pgVar1->m[0].n == uVar16);
    uVar17 = (uchar)((uint)uVar2 >> 8);
    auVar20[1] = -(pgVar1->m[1].n == uVar17);
    uVar18 = (uchar)((uint)uVar2 >> 0x10);
    auVar20[2] = -(pgVar1->m[2].n == uVar18);
    bVar19 = (byte)((uint)uVar2 >> 0x18);
    auVar20[3] = -(pgVar1->m[3].n == bVar19);
    auVar20[4] = -(pgVar1->m[4].n == uVar16);
    auVar20[5] = -(pgVar1->m[5].n == uVar17);
    auVar20[6] = -(pgVar1->m[6].n == uVar18);
    auVar20[7] = -(pgVar1->m[7].n == bVar19);
    auVar20[8] = -(pgVar1->m[8].n == uVar16);
    auVar20[9] = -(pgVar1->m[9].n == uVar17);
    auVar20[10] = -(pgVar1->m[10].n == uVar18);
    auVar20[0xb] = -(pgVar1->m[0xb].n == bVar19);
    auVar20[0xc] = -(pgVar1->m[0xc].n == uVar16);
    auVar20[0xd] = -(pgVar1->m[0xd].n == uVar17);
    auVar20[0xe] = -(pgVar1->m[0xe].n == uVar18);
    auVar20[0xf] = -(bVar7 == bVar19);
    for (uVar11 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe); uVar11 != 0;
        uVar11 = uVar11 - 1 & uVar11) {
      uVar5 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar15 = (ulong)uVar5;
      if (ppVar3[uVar12 * 0xf + uVar15].first == ptr) {
        ppAVar8 = ppVar3[uVar12 * 0xf + uVar15].second._M_ptr;
        _Var10._M_extent_value = ppVar3[uVar12 * 0xf + uVar15].second._M_extent._M_extent_value;
        goto LAB_0013f21a;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar9 & 7] & bVar7) == 0) break;
    lVar13 = uVar12 + uVar14;
    uVar14 = uVar14 + 1;
    uVar12 = lVar13 + 1U & uVar4;
  } while (uVar14 <= uVar4);
  _Var10._M_extent_value = 0;
LAB_0013f21a:
  sVar21._M_extent._M_extent_value = _Var10._M_extent_value;
  sVar21._M_ptr = ppAVar8;
  return sVar21;
}

Assistant:

std::span<const AttributeSymbol* const> Compilation::getAttributes(const void* ptr) const {
    auto it = attributeMap.find(ptr);
    if (it == attributeMap.end())
        return {};

    return it->second;
}